

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::DivideBoundarySkeletonElements(TPZMHMeshControl *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  mapped_type *this_00;
  int64_t iVar5;
  TPZGeoEl **ppTVar6;
  int64_t iVar7;
  int64_t iVar8;
  long *plVar9;
  long in_RDI;
  int is;
  int64_t nsub;
  TPZManVector<TPZGeoEl_*,_10> subels;
  TPZGeoEl *gel;
  int64_t elindex;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  mapdivided;
  bool hasdivided;
  iterator it;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *in_stack_fffffffffffffde8;
  TPZGeoMesh *in_stack_fffffffffffffdf0;
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *in_stack_fffffffffffffdf8;
  int64_t in_stack_fffffffffffffe08;
  TPZManVector<TPZGeoEl_*,_10> *in_stack_fffffffffffffe10;
  mapped_type *in_stack_fffffffffffffe20;
  key_type_conflict1 *in_stack_fffffffffffffe28;
  TPZManVector<long,_10> *in_stack_fffffffffffffe30;
  int local_f4;
  TPZVec<TPZGeoEl_*> local_e8 [4];
  TPZGeoEl *local_68;
  long local_60;
  _Self local_58;
  _Base_ptr local_50;
  byte local_11;
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::_Rb_tree_iterator
            (local_10);
  local_11 = 1;
  while ((local_11 & 1) != 0) {
    local_11 = 0;
    std::
    map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
           *)0x1e0ac27);
    local_50 = (_Base_ptr)
               std::
               map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
               ::begin(in_stack_fffffffffffffde8);
    local_10[0]._M_node = local_50;
    while( true ) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
           ::end(in_stack_fffffffffffffde8);
      bVar2 = std::operator!=(local_10,&local_58);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          0x1e0ac9a);
      local_60 = ppVar4->first;
      TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
      local_68 = TPZGeoMesh::Element(in_stack_fffffffffffffdf0,(int64_t)in_stack_fffffffffffffde8);
      iVar3 = (**(code **)(*(long *)local_68 + 0x1d0))();
      if (iVar3 == 0) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                            0x1e0ad2d);
        std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1e0ad46);
        this_00 = std::
                  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                  ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        std::pair<long,_long>::operator=(this_00,&ppVar4->second);
      }
      else {
        local_11 = 1;
        TPZManVector<TPZGeoEl_*,_10>::TPZManVector
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        (**(code **)(*(long *)local_68 + 0x1c0))(local_68,local_e8);
        iVar5 = TPZVec<TPZGeoEl_*>::size(local_e8);
        for (local_f4 = 0; local_f4 < iVar5; local_f4 = local_f4 + 1) {
          ppTVar6 = TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
          iVar7 = TPZGeoEl::Index(*ppTVar6);
          iVar8 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 200));
          if (iVar8 <= iVar7) {
            ppTVar6 = TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
            TPZGeoEl::Index(*ppTVar6);
            TPZManVector<long,_10>::Resize
                      (in_stack_fffffffffffffe30,(int64_t)in_stack_fffffffffffffe28,
                       &in_stack_fffffffffffffe20->first);
          }
          plVar9 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 200),local_60);
          lVar1 = *plVar9;
          ppTVar6 = TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
          iVar7 = TPZGeoEl::Index(*ppTVar6);
          plVar9 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 200),iVar7);
          *plVar9 = lVar1;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                              0x1e0afd8);
          in_stack_fffffffffffffe30 = (TPZManVector<long,_10> *)&ppVar4->second;
          ppTVar6 = TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
          in_stack_fffffffffffffe28 = (key_type_conflict1 *)TPZGeoEl::Index(*ppTVar6);
          in_stack_fffffffffffffe20 =
               std::
               map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
               ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                             *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          std::pair<long,_long>::operator=
                    (in_stack_fffffffffffffe20,(type)in_stack_fffffffffffffe30);
          lVar1 = local_60;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                              0x1e0b065);
          if (lVar1 == (ppVar4->second).second) {
            in_stack_fffffffffffffe10 =
                 (TPZManVector<TPZGeoEl_*,_10> *)
                 TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
            in_stack_fffffffffffffe08 =
                 TPZGeoEl::Index((TPZGeoEl *)
                                 (in_stack_fffffffffffffe10->super_TPZVec<TPZGeoEl_*>)._vptr_TPZVec)
            ;
            ppTVar6 = TPZVec<TPZGeoEl_*>::operator[](local_e8,(long)local_f4);
            in_stack_fffffffffffffdf8 =
                 (_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                 TPZGeoEl::Index(*ppTVar6);
            in_stack_fffffffffffffdf0 =
                 (TPZGeoMesh *)
                 std::
                 map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                 ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                               *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            *(int64_t *)&in_stack_fffffffffffffdf0->fName = in_stack_fffffffffffffe08;
          }
        }
        TPZManVector<TPZGeoEl_*,_10>::~TPZManVector
                  ((TPZManVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffdf0);
      }
      std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
                (in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    }
    std::
    map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::operator=((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                 *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::
    map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::~map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
            *)0x1e0b17a);
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::NElements((TPZGeoMesh *)0x1e0b1b4);
  TPZManVector<long,_10>::Resize
            (in_stack_fffffffffffffe30,(int64_t)in_stack_fffffffffffffe28,
             &in_stack_fffffffffffffe20->first);
  return;
}

Assistant:

void TPZMHMeshControl::DivideBoundarySkeletonElements()
{
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    bool hasdivided = true;
    while (hasdivided)
    {
        hasdivided = false;
        // mapdivided will contain the new fInterface structure
        std::map<int64_t, std::pair<int64_t,int64_t> > mapdivided;
        for (it=fInterfaces.begin(); it!=fInterfaces.end(); it++) {
            int64_t elindex = it->first;
            // if the following condition is not satisfied then the interface is not a boundary
//            if (elindex != it->second.second) {
//                mapdivided[it->first] = it->second;
//                continue;
//            }
            TPZGeoEl *gel = fGMesh->Element(elindex);
            // if the geometric element associated with the interface was not divided
            // then the interface will not be divided either
            if(!gel->HasSubElement())
            {
                mapdivided[it->first] = it->second;
                continue;
            }
            hasdivided = true;
            TPZManVector<TPZGeoEl *,10> subels;
            gel->Divide(subels);
            int64_t nsub = subels.size();
            for (int is=0; is<nsub; is++) {
                if (subels[is]->Index() >= fGeoToMHMDomain.size()) {
                    fGeoToMHMDomain.Resize(subels[is]->Index()+1000, -1);
                }
                fGeoToMHMDomain[subels[is]->Index()] = fGeoToMHMDomain[elindex];
                mapdivided[subels[is]->Index()] = it->second;
                // for boundary elements, the second element is the interface element
                // update the interface data structure
                if(elindex == it->second.second)
                {
                    mapdivided[subels[is]->Index()].second = subels[is]->Index();
                }
            }
        }
        fInterfaces = mapdivided;
    }
//    BuildWrapMesh(fGMesh->Dimension());
//    BuildWrapMesh(fGMesh->Dimension()-1);
    fGeoToMHMDomain.Resize(fGMesh->NElements(), -1);
}